

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

int __thiscall smf::MidiFile::getTicksPerQuarterNote(MidiFile *this)

{
  return this->m_ticksPerQuarterNote;
}

Assistant:

int MidiFile::getTicksPerQuarterNote(void) const {
	if (m_ticksPerQuarterNote == 0xE728) {
		// this is a special case which is the SMPTE time code
		// setting for 25 frames a second with 40 subframes
		// which means one tick per millisecond.  When SMPTE is
		// being used, there is no real concept of the quarter note,
		// so presume 60 bpm as a simiplification here.
		// return 1000;
	}
	return m_ticksPerQuarterNote;
}